

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler.c
# Opt level: O1

void WebPRescalerExportRowShrink_C(WebPRescaler *wrk)

{
  uint8_t *puVar1;
  rescaler_t *prVar2;
  rescaler_t *prVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  rescaler_t rVar8;
  int iVar9;
  
  puVar1 = wrk->dst;
  prVar2 = wrk->irow;
  uVar6 = wrk->num_channels * wrk->dst_width;
  iVar5 = wrk->y_accum * wrk->fy_scale;
  if (iVar5 == 0) {
    if (0 < (int)uVar6) {
      uVar7 = 0;
      do {
        iVar5 = (int)((ulong)wrk->fxy_scale * (ulong)prVar2[uVar7] + 0x80000000 >> 0x20);
        if (0xff < iVar5) {
          iVar5 = 0xff;
        }
        puVar1[uVar7] = (uint8_t)iVar5;
        prVar2[uVar7] = 0;
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
  }
  else if (0 < (int)uVar6) {
    prVar3 = wrk->frow;
    uVar7 = 0;
    do {
      rVar8 = (rescaler_t)((ulong)prVar3[uVar7] * (ulong)(uint)-iVar5 >> 0x20);
      iVar9 = (int)((ulong)wrk->fxy_scale * (ulong)(prVar2[uVar7] - rVar8) + 0x80000000 >> 0x20);
      iVar4 = 0xff;
      if (iVar9 < 0x100) {
        iVar4 = iVar9;
      }
      puVar1[uVar7] = (uint8_t)iVar4;
      prVar2[uVar7] = rVar8;
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  return;
}

Assistant:

void WebPRescalerExportRowShrink_C(WebPRescaler* const wrk) {
  int x_out;
  uint8_t* const dst = wrk->dst;
  rescaler_t* const irow = wrk->irow;
  const int x_out_max = wrk->dst_width * wrk->num_channels;
  const rescaler_t* const frow = wrk->frow;
  const uint32_t yscale = wrk->fy_scale * (-wrk->y_accum);
  assert(!WebPRescalerOutputDone(wrk));
  assert(wrk->y_accum <= 0);
  assert(!wrk->y_expand);
  if (yscale) {
    for (x_out = 0; x_out < x_out_max; ++x_out) {
      const uint32_t frac = (uint32_t)MULT_FIX_FLOOR(frow[x_out], yscale);
      const int v = (int)MULT_FIX(irow[x_out] - frac, wrk->fxy_scale);
      dst[x_out] = (v > 255) ? 255u : (uint8_t)v;
      irow[x_out] = frac;   // new fractional start
    }
  } else {
    for (x_out = 0; x_out < x_out_max; ++x_out) {
      const int v = (int)MULT_FIX(irow[x_out], wrk->fxy_scale);
      dst[x_out] = (v > 255) ? 255u : (uint8_t)v;
      irow[x_out] = 0;
    }
  }
}